

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O3

int blake2s_init_param(blake2s_state *S,blake2s_param *P)

{
  long lVar1;
  
  S->buflen = 0;
  S->outlen = 0;
  S->buf[0x30] = '\0';
  S->buf[0x31] = '\0';
  S->buf[0x32] = '\0';
  S->buf[0x33] = '\0';
  S->buf[0x34] = '\0';
  S->buf[0x35] = '\0';
  S->buf[0x36] = '\0';
  S->buf[0x37] = '\0';
  S->buf[0x38] = '\0';
  S->buf[0x39] = '\0';
  S->buf[0x3a] = '\0';
  S->buf[0x3b] = '\0';
  S->buf[0x3c] = '\0';
  S->buf[0x3d] = '\0';
  S->buf[0x3e] = '\0';
  S->buf[0x3f] = '\0';
  S->buf[0x20] = '\0';
  S->buf[0x21] = '\0';
  S->buf[0x22] = '\0';
  S->buf[0x23] = '\0';
  S->buf[0x24] = '\0';
  S->buf[0x25] = '\0';
  S->buf[0x26] = '\0';
  S->buf[0x27] = '\0';
  S->buf[0x28] = '\0';
  S->buf[0x29] = '\0';
  S->buf[0x2a] = '\0';
  S->buf[0x2b] = '\0';
  S->buf[0x2c] = '\0';
  S->buf[0x2d] = '\0';
  S->buf[0x2e] = '\0';
  S->buf[0x2f] = '\0';
  S->buf[0x10] = '\0';
  S->buf[0x11] = '\0';
  S->buf[0x12] = '\0';
  S->buf[0x13] = '\0';
  S->buf[0x14] = '\0';
  S->buf[0x15] = '\0';
  S->buf[0x16] = '\0';
  S->buf[0x17] = '\0';
  S->buf[0x18] = '\0';
  S->buf[0x19] = '\0';
  S->buf[0x1a] = '\0';
  S->buf[0x1b] = '\0';
  S->buf[0x1c] = '\0';
  S->buf[0x1d] = '\0';
  S->buf[0x1e] = '\0';
  S->buf[0x1f] = '\0';
  S->buf[0] = '\0';
  S->buf[1] = '\0';
  S->buf[2] = '\0';
  S->buf[3] = '\0';
  S->buf[4] = '\0';
  S->buf[5] = '\0';
  S->buf[6] = '\0';
  S->buf[7] = '\0';
  S->buf[8] = '\0';
  S->buf[9] = '\0';
  S->buf[10] = '\0';
  S->buf[0xb] = '\0';
  S->buf[0xc] = '\0';
  S->buf[0xd] = '\0';
  S->buf[0xe] = '\0';
  S->buf[0xf] = '\0';
  S->t[0] = 0;
  S->t[1] = 0;
  S->f[0] = 0;
  S->f[1] = 0;
  *(undefined8 *)&S->last_node = 0;
  S->h[0] = 0x6a09e667;
  S->h[1] = 0xbb67ae85;
  S->h[2] = 0x3c6ef372;
  S->h[3] = 0xa54ff53a;
  S->h[4] = 0x510e527f;
  S->h[5] = 0x9b05688c;
  S->h[6] = 0x1f83d9ab;
  S->h[7] = 0x5be0cd19;
  lVar1 = 0;
  do {
    S->h[lVar1] = S->h[lVar1] ^ *(uint *)(P->salt + lVar1 * 4 + -0x10);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  S->outlen = (ulong)P->digest_length;
  return 0;
}

Assistant:

int blake2s_init_param( blake2s_state *S, const blake2s_param *P )
{
  const unsigned char *p = ( const unsigned char * )( P );
  size_t i;

  blake2s_init0( S );

  /* IV XOR ParamBlock */
  for( i = 0; i < 8; ++i )
    S->h[i] ^= load32( &p[i * 4] );

  S->outlen = P->digest_length;
  return 0;
}